

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_synaptic_enhancement(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (bVar1) {
    send_to_char("They are already affected by synaptic enhancement.\n\r",ch);
    return;
  }
  bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_synaptic_impairment);
  if (bVar1) {
    send_to_char("The haze lifts from your mind, and you can think clearly once again.\n\r",
                 (CHAR_DATA *)vo);
    act("$n appears to be thinking normally again.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    switchD_00333f01::default((CHAR_DATA *)vo,(int)gsn_synaptic_impairment);
    return;
  }
  init_affect(&af);
  af.where = 0;
  af.aftype = get_spell_aftype(ch);
  af.type = (short)sn;
  af.level = (short)level;
  af.location = 0;
  af.modifier = 0;
  af.duration = (short)(level / 4);
  af.mod_name = 7;
  affect_to_char((CHAR_DATA *)vo,&af);
  act("$n twitches as $e suddenly looks more aware.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
  act("Your mind suddenly feels much clearer and your reflexes sharpen.",(CHAR_DATA *)vo,(void *)0x0
      ,(void *)0x0,3);
  return;
}

Assistant:

void spell_synaptic_enhancement(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		send_to_char("They are already affected by synaptic enhancement.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_synaptic_impairment))
	{
		send_to_char("The haze lifts from your mind, and you can think clearly once again.\n\r", victim);
		act("$n appears to be thinking normally again.", victim, nullptr, nullptr, TO_ROOM);
		affect_strip(victim, gsn_synaptic_impairment);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.location = 0;
	af.modifier = 0;
	af.duration = level / 4;
	af.mod_name = MOD_CONC;
	affect_to_char(victim, &af);

	act("$n twitches as $e suddenly looks more aware.", victim, 0, 0, TO_ROOM);
	act("Your mind suddenly feels much clearer and your reflexes sharpen.", victim, 0, 0, TO_CHAR);
}